

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

int __thiscall
kj::anon_unknown_36::PromiseNetworkAddressHttpClient::connect
          (PromiseNetworkAddressHttpClient *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  NetworkAddressHttpClient *pNVar1;
  _func_int **pp_Var2;
  SourceLocation location;
  void *pvVar3;
  int __flags;
  undefined4 in_register_0000000c;
  undefined8 uVar4;
  StringPtr *params;
  void *__child_stack;
  undefined4 in_register_00000034;
  __fn *in_R8;
  __fn *__arg;
  undefined1 *in_R9;
  ForkHub<kj::_::Void> *location_00;
  SplitTuplePromise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream>_>_>_>
  split;
  void *continuationTracePtr;
  ForkedPromise<void> local_130;
  OwnPromiseNode local_120;
  TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>
  local_118;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_108;
  code *local_100;
  char *local_f8;
  char *pcStack_f0;
  undefined8 local_e8;
  sockaddr *local_e0;
  undefined8 local_d8;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_d0;
  undefined1 local_c8;
  undefined8 local_c0;
  anon_class_144_4_7ef71648_for_func local_b8;
  
  uVar4 = CONCAT44(in_register_0000000c,__len);
  pNVar1 = (((PromiseNetworkAddressHttpClient *)CONCAT44(in_register_00000034,__fd))->client).ptr.
           ptr;
  local_e0 = __addr;
  local_d8 = uVar4;
  if (pNVar1 == (NetworkAddressHttpClient *)0x0) {
    __arg = in_R8;
    ForkedPromise<void>::addBranch(&local_130);
    __flags = (int)uVar4;
    local_b8.this = (PromiseNetworkAddressHttpClient *)CONCAT44(in_register_00000034,__fd);
    str<kj::StringPtr&>(&local_b8.host,(kj *)&local_e0,params);
    HttpHeaders::clone(&local_b8.headers,in_R8,__child_stack,__flags,__arg);
    local_b8.settings.useTls = (bool)*in_R9;
    local_b8.settings.tlsStarter.ptr =
         *(Maybe<kj::Function<kj::Promise<void>_(kj::StringPtr)>_> **)(in_R9 + 8);
    local_100 = kj::_::
                SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6253:11)>
                ::anon_class_144_4_7ef71648_for_func::operator();
    pp_Var2 = local_130.hub.disposer[1]._vptr_Disposer;
    if (pp_Var2 == (_func_int **)0x0 || (ulong)((long)local_130.hub.disposer - (long)pp_Var2) < 0xb0
       ) {
      pvVar3 = operator_new(0x400);
      location_00 = (ForkHub<kj::_::Void> *)((long)pvVar3 + 0x350);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::_lambda()_1_,void*&>
                ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6253:11)>
                  *)location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_130,
                 &local_b8,&local_100);
      *(void **)((long)pvVar3 + 0x358) = pvVar3;
    }
    else {
      local_130.hub.disposer[1]._vptr_Disposer = (_func_int **)0x0;
      location_00 = (ForkHub<kj::_::Void> *)(local_130.hub.disposer + -0x16);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::_lambda()_1_,void*&>
                ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6253:11)>
                  *)location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_130,
                 &local_b8,&local_100);
      local_130.hub.disposer[-0x15]._vptr_Disposer = pp_Var2;
    }
    local_108.ptr = (PromiseNode *)0x0;
    local_d0.ptr = (PromiseNode *)0x0;
    local_130.hub.ptr = location_00;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_d0);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_108);
    local_f8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    pcStack_f0 = "connect";
    local_e8 = 0x140000186c;
    location.function = "connect";
    location.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    location.lineNumber = 0x186c;
    location.columnNumber = 0x14;
    Promise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>_>
    ::split((Promise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>_>
             *)&local_118,location);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_130.hub.ptr);
    (anonymous_namespace)::PromiseNetworkAddressHttpClient::
    connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::{lambda()#1}::
    ~HttpConnectSettings((_lambda___1_ *)&local_b8);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_130);
    local_120.ptr =
         (PromiseNode *)
         local_118.super_TupleElement<1U,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>
         .value.super_PromiseBase.node.ptr;
    (this->super_HttpClient)._vptr_HttpClient =
         (_func_int **)
         local_118.super_TupleElement<0U,_kj::Promise<kj::HttpClient::ConnectRequest::Status>_>.
         value.super_PromiseBase.node.ptr;
    local_118.super_TupleElement<0U,_kj::Promise<kj::HttpClient::ConnectRequest::Status>_>.value.
    super_PromiseBase.node.ptr = (Promise<kj::HttpClient::ConnectRequest::Status>)(PromiseBase)0x0;
    local_118.super_TupleElement<1U,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>.
    value.super_PromiseBase.node.ptr =
         (Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>)(PromiseBase)0x0;
    newPromisedStream((kj *)&this->promise,
                      (Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)&local_120);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_120);
    kj::_::
    TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>
    ::~TupleImpl(&local_118);
  }
  else {
    local_c8 = *in_R9;
    local_c0 = *(undefined8 *)(in_R9 + 8);
    NetworkAddressHttpClient::connect((NetworkAddressHttpClient *)this,(int)pNVar1,__addr,__len);
  }
  return (int)this;
}

Assistant:

ConnectRequest connect(
      kj::StringPtr host, const HttpHeaders& headers, HttpConnectSettings settings) override {
    KJ_IF_SOME(c, client) {
      return c->connect(host, headers, settings);
    } else {
      auto split = promise.addBranch().then(
          [this, host=kj::str(host), headers=headers.clone(), settings]() mutable
          -> kj::Tuple<kj::Promise<ConnectRequest::Status>,
                       kj::Promise<kj::Own<kj::AsyncIoStream>>> {
        auto request = KJ_ASSERT_NONNULL(client)->connect(host, headers, kj::mv(settings));
        return kj::tuple(kj::mv(request.status), kj::mv(request.connection));
      }).split();

      return ConnectRequest {
        kj::mv(kj::get<0>(split)),
        kj::newPromisedStream(kj::mv(kj::get<1>(split)))
      };
    }